

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::ConductorBxDF::f(ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  float fVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  Float FVar12;
  Float FVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar25;
  undefined1 auVar26 [64];
  float fVar27;
  float fVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  SampledSpectrum SVar31;
  Tuple3<pbrt::Vector3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  auVar26._4_60_ = wi._12_60_;
  auVar26._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._8_56_ = wi._8_56_;
  auVar24._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._4_60_ = wo._12_60_;
  auVar21._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._8_56_ = wo._8_56_;
  auVar18._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_58._0_8_ = vmovlps_avx(auVar18._0_16_);
  uVar14 = 0;
  local_68._0_8_ = vmovlps_avx(auVar24._0_16_);
  if ((((auVar21._0_4_ * auVar26._0_4_ <= 0.0) ||
       (auVar30 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                             ZEXT416((uint)(this->mfDistrib).alpha_x)), auVar30._0_4_ < 0.001)) ||
      ((auVar21._0_4_ == 0.0 && (!NAN(auVar21._0_4_))))) ||
     ((auVar26._0_4_ == 0.0 && (!NAN(auVar26._0_4_))))) {
    uVar29 = 0;
  }
  else {
    fVar27 = auVar21._0_4_ + auVar26._0_4_;
    auVar30._0_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.x + wo.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar30._4_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.y + wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar30._8_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.z + wo.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar30._12_4_ = wi._12_4_ + wo._12_4_;
    if (((fVar27 == 0.0) && (auVar30._0_4_ == 0.0)) && (!NAN(auVar30._0_4_))) {
      auVar10 = vmovshdup_avx(auVar30);
      uVar29 = 0;
      if ((auVar10._0_4_ == 0.0) && (!NAN(auVar10._0_4_))) goto LAB_00319250;
    }
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    local_18 = vandps_avx(auVar21._0_16_,auVar10);
    local_28 = vandps_avx(auVar26._0_16_,auVar10);
    auVar15._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar15._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar15._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar15._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar10 = vhaddps_avx(auVar15,auVar15);
    auVar10 = ZEXT416((uint)(fVar27 * fVar27 + auVar10._0_4_));
    auVar10 = vsqrtss_avx(auVar10,auVar10);
    fVar28 = auVar10._0_4_;
    auVar19._4_4_ = fVar28;
    auVar19._0_4_ = fVar28;
    auVar19._8_4_ = fVar28;
    auVar19._12_4_ = fVar28;
    fVar27 = fVar27 / fVar28;
    auVar30 = vdivps_avx(auVar30,auVar19);
    uVar14 = auVar30._8_8_;
    auVar16._0_4_ = auVar30._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar16._4_4_ = auVar30._4_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar16._8_4_ = auVar30._8_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._12_4_ = auVar30._12_4_ * wi._12_4_;
    auVar10 = vmovshdup_avx(auVar16);
    auVar10 = vfmadd231ss_fma(auVar10,auVar30,auVar24._0_16_);
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar27),auVar26._0_16_);
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(auVar10,auVar5);
    uVar29 = auVar10._8_8_;
    local_68.z = auVar26._0_4_;
    local_58.z = auVar21._0_4_;
    SVar31 = FrConductor(auVar10._0_4_,&this->eta,&this->k);
    local_48 = SVar31.values.values._8_8_;
    local_38 = SVar31.values.values._0_8_;
    fVar28 = 0.0;
    fVar27 = fVar27 * fVar27;
    auVar10 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar27)),ZEXT816(0) << 0x40);
    fVar11 = auVar10._0_4_ / fVar27;
    if ((ABS(fVar11) != INFINITY) && (1e-16 <= fVar27 * fVar27)) {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      auVar23._0_4_ = auVar10._0_4_;
      if ((auVar23._0_4_ != 0.0) || (NAN(auVar23._0_4_))) {
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = auVar23._0_4_;
        auVar23._12_4_ = auVar23._0_4_;
        auVar30 = vdivps_avx(auVar30,auVar23);
        fVar22 = (this->mfDistrib).alpha_x;
        auVar6._8_4_ = 0x3f800000;
        auVar6._0_8_ = 0x3f8000003f800000;
        auVar6._12_4_ = 0x3f800000;
        uVar2 = vcmpps_avx512vl(auVar30,auVar6,0xe);
        uVar3 = vcmpss_avx512f(auVar30,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar4 = (bool)((byte)uVar3 & 1);
        auVar10 = vmovshdup_avx(auVar30);
        bVar7 = (byte)(uVar2 >> 1);
        fVar28 = (float)((uint)bVar4 * -0x40800000 +
                        (uint)!bVar4 *
                        ((uint)((byte)uVar2 & 1) * 0x3f800000 +
                        (uint)!(bool)((byte)uVar2 & 1) * auVar30._0_4_));
        uVar3 = vcmpss_avx512f(auVar10,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar25 = (fVar28 * fVar28) / (fVar22 * fVar22);
        fVar28 = (float)((uint)bVar4 * -0x40800000 +
                        (uint)!bVar4 *
                        ((uint)(bVar7 & 1) * 0x3f800000 + (uint)!(bool)(bVar7 & 1) * auVar10._0_4_))
        ;
      }
      else {
        fVar22 = (this->mfDistrib).alpha_x;
        fVar25 = 1.0 / (fVar22 * fVar22);
      }
      fVar1 = (this->mfDistrib).alpha_y;
      fVar28 = fVar11 * (fVar25 + (fVar28 * fVar28) / (fVar1 * fVar1)) + 1.0;
      fVar28 = 1.0 / (fVar27 * fVar27 * fVar22 * 3.1415927 * fVar1 * fVar28 * fVar28);
    }
    uStack_40 = uVar14;
    uStack_30 = uVar29;
    FVar12 = TrowbridgeReitzDistribution::Lambda(&this->mfDistrib,(Vector3f *)&local_58);
    FVar13 = TrowbridgeReitzDistribution::Lambda(&this->mfDistrib,(Vector3f *)&local_68);
    auVar9._8_8_ = uStack_30;
    auVar9._0_8_ = local_38;
    auVar8._8_8_ = uStack_40;
    auVar8._0_8_ = local_48;
    auVar30 = vunpcklpd_avx(auVar9,auVar8);
    fVar28 = (1.0 / (FVar12 + 1.0 + FVar13)) * fVar28;
    auVar17._0_4_ = fVar28 * auVar30._0_4_;
    auVar17._4_4_ = fVar28 * auVar30._4_4_;
    auVar17._8_4_ = fVar28 * auVar30._8_4_;
    auVar17._12_4_ = fVar28 * auVar30._12_4_;
    fVar27 = (float)local_28._0_4_ * 4.0 * (float)local_18._0_4_;
    auVar20._4_4_ = fVar27;
    auVar20._0_4_ = fVar27;
    auVar20._8_4_ = fVar27;
    auVar20._12_4_ = fVar27;
    auVar30 = vdivps_avx(auVar17,auVar20);
    uVar14 = auVar30._0_8_;
    auVar30 = vshufpd_avx(auVar30,auVar30,1);
    uVar29 = auVar30._0_8_;
  }
LAB_00319250:
  SVar31.values.values[2] = (float)(int)uVar29;
  SVar31.values.values[3] = (float)(int)((ulong)uVar29 >> 0x20);
  SVar31.values.values[0] = (float)(int)uVar14;
  SVar31.values.values[1] = (float)(int)((ulong)uVar14 >> 0x20);
  return (SampledSpectrum)SVar31.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (!SameHemisphere(wo, wi))
            return {};
        if (mfDistrib.EffectivelySmooth())
            return {};
        // Evaluate Torrance--Sparrow model for conductor BRDF
        // Compute cosines and $\wh$ for conductor BRDF
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        Vector3f wh = wi + wo;
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return {};
        wh = Normalize(wh);

        // Evaluate Fresnel factor _F_ for conductor BRDF
        Float frCosTheta_i = AbsDot(wi, wh);
        SampledSpectrum F = FrConductor(frCosTheta_i, eta, k);

        return mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F / (4 * cosTheta_i * cosTheta_o);
    }